

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O2

void __thiscall
Saturation::ExtensionalityClauseContainer::print(ExtensionalityClauseContainer *this,ostream *out)

{
  Literal *this_00;
  ExtensionalityClause *pEVar1;
  bool bVar2;
  ostream *poVar3;
  List<Saturation::ExtensionalityClause> *pLVar4;
  ExtensionalityClause c;
  TermList local_98 [2];
  IteratorBase local_88;
  string local_70;
  string local_50;
  
  poVar3 = std::operator<<(out,"#####################");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_88._next = (this->_clausesBySort)._entries;
  local_88._last = (this->_clausesBySort)._afterLast;
  local_88._timestamp = (this->_clausesBySort)._timestamp;
  while( true ) {
    bVar2 = Lib::
            DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::IteratorBase::hasNext(&local_88);
    if (!bVar2) break;
    pLVar4 = (local_88._next)->_val;
    local_88._next = local_88._next + 1;
    while (pLVar4 != (List<Saturation::ExtensionalityClause> *)0x0) {
      local_98[0]._content = (pLVar4->_head).sort._content;
      pEVar1 = &pLVar4->_head;
      this_00 = (pLVar4->_head).literal;
      pLVar4 = pLVar4->_tail;
      Kernel::Clause::toString_abi_cxx11_(&local_50,pEVar1->clause);
      poVar3 = std::operator<<(out,(string *)&local_50);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      Kernel::Literal::toString_abi_cxx11_(&local_70,this_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = Kernel::operator<<(poVar3,local_98);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  poVar3 = std::operator<<(out,"#####################");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void ExtensionalityClauseContainer::print (std::ostream& out) {
  out << "#####################" << endl;

  ClausesBySort::Iterator cbs(_clausesBySort);

  while(cbs.hasNext()){
    ExtensionalityClauseList* l = cbs.next();
    ExtensionalityClauseList::Iterator it(l);
    while(it.hasNext()) {
      ExtensionalityClause c = it.next();
      out << c.clause->toString() << endl
          << c.literal->toString() << endl
          << c.sort << endl;
    }
  }
  
  out << "#####################" << endl;
}